

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.cpp
# Opt level: O2

Ref<embree::Image> __thiscall embree::loadSTB(embree *this,FileName *fileName)

{
  Image *pIVar1;
  stbi_uc *__ptr;
  ImageT<embree::Col4<unsigned_char>_> *this_00;
  runtime_error *this_01;
  long lVar2;
  size_t y;
  size_t sVar3;
  long lVar4;
  size_t width_00;
  size_t x;
  size_t sVar5;
  int channels;
  int height;
  int width;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  Image *local_60;
  size_t local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)local_88,(string *)fileName);
  __ptr = stbi_load((char *)CONCAT44(local_88._4_4_,local_88._0_4_),&width,&height,&channels,0);
  std::__cxx11::string::~string((string *)local_88);
  if (__ptr == (stbi_uc *)0x0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_50,(string *)fileName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   "Could not load ",&local_50);
    std::runtime_error::runtime_error(this_01,(string *)local_88);
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (ImageT<embree::Col4<unsigned_char>_> *)::operator_new(0x48);
  width_00 = (size_t)width;
  std::__cxx11::string::string((string *)local_88,(string *)fileName);
  local_60 = (Image *)this;
  ImageT<embree::Col4<unsigned_char>_>::ImageT(this_00,width_00,(long)height,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  lVar4 = 0;
  sVar3 = 0;
  local_58 = (long)height;
  do {
    if (sVar3 == local_58) {
      free(__ptr);
      pIVar1 = local_60;
      (local_60->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
      (*(this_00->super_Image).super_RefCount._vptr_RefCount[2])(this_00);
      return (Ref<embree::Image>)pIVar1;
    }
    for (sVar5 = 0; width_00 != sVar5; sVar5 = sVar5 + 1) {
      local_88._0_4_ = 0.0;
      local_88._4_4_ = 0.0;
      if ((long)channels < 1) {
LAB_0019f4ce:
        fStack_80 = (float)local_88._0_4_;
        if (channels != 1) {
          fStack_80 = 0.0;
        }
LAB_0019f4d9:
        fStack_7c = 1.0;
      }
      else {
        lVar2 = (lVar4 + sVar5) * (long)channels;
        local_88._0_4_ = (float)__ptr[lVar2] * 0.003921569;
        local_88._4_4_ = local_88._0_4_;
        if ((channels == 1) ||
           (local_88._4_4_ = (float)__ptr[lVar2 + 1] * 0.003921569, (uint)channels < 3))
        goto LAB_0019f4ce;
        fStack_80 = (float)__ptr[lVar2 + 2] * 0.003921569;
        if (channels == 3) goto LAB_0019f4d9;
        fStack_7c = (float)__ptr[lVar2 + 3] * 0.003921569;
      }
      (*(this_00->super_Image).super_RefCount._vptr_RefCount[5])(this_00,sVar5,sVar3,local_88);
    }
    sVar3 = sVar3 + 1;
    lVar4 = lVar4 + width_00;
  } while( true );
}

Assistant:

Ref<Image> loadSTB(const FileName& fileName)
  {
    int width, height, channels;
    unsigned char *pixels = stbi_load(fileName.str().c_str(), &width, &height, &channels, 0);
    if(pixels == nullptr) {
      THROW_RUNTIME_ERROR("Could not load " + fileName.str());
    }

    Image* out = new Image4uc(width, height, fileName);
    const float rcpMaxColor = 1.f/255.f;
    for (size_t y = 0; y < height; y++)
    {
      for (size_t x = 0; x < width; x++)
      {
        float r = (channels > 0) ? (float(pixels[(y*width+x)*channels+0]) * rcpMaxColor) : 0.f;
        float g = (channels > 1) ? (float(pixels[(y*width+x)*channels+1]) * rcpMaxColor) : r;
        float b = (channels > 2) ? (float(pixels[(y*width+x)*channels+2]) * rcpMaxColor) : ((channels == 1) ? r : 0.f);
        float a = (channels > 3) ? (float(pixels[(y*width+x)*channels+3]) * rcpMaxColor) : 1.f;
        out->set(x, y, Color4(r,g,b,a));
      }
    }

    stbi_image_free(pixels);

    return out;
  }